

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O2

void parse_object_should_parse_objects_with_multiple_elements(void)

{
  cJSON *child_item;
  ulong uVar1;
  long lVar2;
  
  assert_parse_object("{\"one\":1\t,\t\"two\"\n:2, \"three\":3}");
  child_item = (cJSON *)&item[0].child;
  assert_is_child(item[0].child,"one",8);
  assert_is_child((item[0].child)->next,"two",8);
  assert_is_child((item[0].child)->next->next,"three",8);
  reset(item);
  assert_parse_object(
                     "{\"one\":1, \"NULL\":null, \"TRUE\":true, \"FALSE\":false, \"array\":[], \"world\":\"hello\", \"object\":{}}"
                     );
  lVar2 = 0;
  uVar1 = 0;
  while ((uVar1 < 7 && (child_item = child_item->next, child_item != (cJSON *)0x0))) {
    assert_is_child(child_item,
                    (char *)((long)&DAT_0010509c + (long)*(int *)((long)&DAT_0010509c + lVar2)),
                    *(int *)((long)&DAT_00105080 + lVar2));
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 4;
  }
  UnityAssertEqualNumber(uVar1,7,0,0x95,0x14);
  reset(item);
  return;
}

Assistant:

static void parse_object_should_parse_objects_with_multiple_elements(void)
{
    assert_parse_object("{\"one\":1\t,\t\"two\"\n:2, \"three\":3}");
    assert_is_child(item->child, "one", cJSON_Number);
    assert_is_child(item->child->next, "two", cJSON_Number);
    assert_is_child(item->child->next->next, "three", cJSON_Number);
    reset(item);

    {
        size_t i = 0;
        cJSON *node = NULL;
        int expected_types[7] =
        {
            cJSON_Number,
            cJSON_NULL,
            cJSON_True,
            cJSON_False,
            cJSON_Array,
            cJSON_String,
            cJSON_Object
        };
        const char *expected_names[7] =
        {
            "one",
            "NULL",
            "TRUE",
            "FALSE",
            "array",
            "world",
            "object"
        };
        assert_parse_object("{\"one\":1, \"NULL\":null, \"TRUE\":true, \"FALSE\":false, \"array\":[], \"world\":\"hello\", \"object\":{}}");

        node = item->child;
        for (
                i = 0;
                (i < (sizeof(expected_types)/sizeof(int)))
                && (node != NULL);
                (void)i++, node = node->next)
        {
            assert_is_child(node, expected_names[i], expected_types[i]);
        }
        TEST_ASSERT_EQUAL_INT(i, 7);
        reset(item);
    }
}